

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_hv_accept.cpp
# Opt level: O0

int __thiscall
ir_function::accept(ir_function *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  ir_visitor_status iVar1;
  undefined4 in_register_00000034;
  ir_hierarchical_visitor *v;
  int local_38;
  int local_34;
  ir_visitor_status s;
  ir_hierarchical_visitor *v_local;
  ir_function *this_local;
  
  v = (ir_hierarchical_visitor *)CONCAT44(in_register_00000034,__fd);
  local_34 = (*v->_vptr_ir_hierarchical_visitor[0xc])();
  if (local_34 == 0) {
    iVar1 = visit_list_elements(v,&this->signatures,false);
    if (iVar1 == visit_stop) {
      local_38 = 2;
    }
    else {
      local_38 = (*v->_vptr_ir_hierarchical_visitor[0xd])(v,this);
    }
    this_local._4_4_ = local_38;
  }
  else {
    if (local_34 == 1) {
      local_34 = 0;
    }
    this_local._4_4_ = local_34;
  }
  return this_local._4_4_;
}

Assistant:

ir_visitor_status
ir_function::accept(ir_hierarchical_visitor *v)
{
   ir_visitor_status s = v->visit_enter(this);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   s = visit_list_elements(v, &this->signatures, false);
   return (s == visit_stop) ? s : v->visit_leave(this);
}